

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O2

bool __thiscall Assimp::Importer::SetPropertyString(Importer *this,char *szName,string *value)

{
  bool bVar1;
  
  if (this->pimpl != (ImporterPimpl *)0x0) {
    bVar1 = SetGenericProperty<std::__cxx11::string>(&this->pimpl->mStringProperties,szName,value);
    return bVar1;
  }
  __assert_fail("nullptr != pimpl",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Importer.cpp"
                ,0x40b,"bool Assimp::Importer::SetPropertyString(const char *, const std::string &)"
               );
}

Assistant:

bool Importer::SetPropertyString(const char* szName, const std::string& value) {
    ai_assert(nullptr != pimpl);
    
    bool existing;
    ASSIMP_BEGIN_EXCEPTION_REGION();
        existing = SetGenericProperty<std::string>(pimpl->mStringProperties, szName,value);
    ASSIMP_END_EXCEPTION_REGION(bool);
    return existing;
}